

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::anon_unknown_16::NFDIterator::nextDecomposedCodePoint
          (NFDIterator *this,Normalizer2Impl *nfcImpl,UChar32 c)

{
  UChar *pUVar1;
  
  if (this->index < 0) {
    pUVar1 = Normalizer2Impl::getDecomposition(nfcImpl,c,this->buffer,&this->length);
    this->decomp = pUVar1;
    if (pUVar1 != (UChar *)0x0) {
      this->index = 1;
      c = (UChar32)(ushort)*pUVar1;
      if ((c & 0xfc00U) == 0xd800) {
        this->index = 2;
        c = c * 0x400 + (uint)(ushort)pUVar1[1] + 0xfca02400;
      }
    }
  }
  return c;
}

Assistant:

UChar32 nextDecomposedCodePoint(const Normalizer2Impl &nfcImpl, UChar32 c) {
        if(index >= 0) { return c; }
        decomp = nfcImpl.getDecomposition(c, buffer, length);
        if(decomp == NULL) { return c; }
        index = 0;
        U16_NEXT_UNSAFE(decomp, index, c);
        return c;
    }